

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SigmaStarAbstract.h
# Opt level: O1

DFA<covenant::Sym> * __thiscall
covenant::SigmaStarAbstract<covenant::Sym>::do_abstraction
          (DFA<covenant::Sym> *__return_storage_ptr__,SigmaStarAbstract<covenant::Sym> *this,CFG *g,
          bool is_regular)

{
  pointer this_00;
  iterator __position;
  DFA<covenant::Sym> *__return_storage_ptr___00;
  undefined8 uVar1;
  undefined8 uVar2;
  State s;
  const_iterator cVar3;
  string *psVar4;
  sp_counted_base *__addr_len;
  sockaddr *__addr;
  int iVar5;
  uint uVar6;
  bool bVar7;
  DFA<covenant::Sym> dfa;
  DFA<covenant::Sym> local_3d8;
  DFA<covenant::Sym> *local_360;
  element_type *local_358;
  shared_count local_350;
  undefined1 *local_348;
  long local_340;
  undefined1 local_338 [16];
  key_type local_328;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  pointer pvStack_2e8;
  pointer local_2e0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2d8;
  _Bit_type *local_2c0;
  uint uStack_2b8;
  _Bit_type *local_2b0;
  uint uStack_2a8;
  undefined4 uStack_2a4;
  _Bit_pointer local_2a0;
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  local_298;
  undefined1 local_278 [48];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_248;
  pointer local_230;
  uint local_228;
  pointer local_220;
  uint local_218;
  pointer local_210;
  CFGConnect local_1f8;
  pointer local_170;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  local_158;
  shared_count local_120 [2];
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  local_110;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_f8;
  _Bit_type *local_e0;
  uint local_d8;
  _Bit_type *local_d0;
  uint local_c8;
  _Bit_pointer local_c0;
  CFG local_b0;
  
  local_3d8._tfac.px = (g->_tfac).px;
  __addr_len = (g->_tfac).pn.pi_;
  if (__addr_len != (sp_counted_base *)0x0) {
    LOCK();
    __addr_len->use_count_ = __addr_len->use_count_ + 1;
    UNLOCK();
  }
  if (__addr_len != (sp_counted_base *)0x0) {
    LOCK();
    __addr_len->use_count_ = __addr_len->use_count_ + 1;
    UNLOCK();
  }
  local_3d8.start = 0;
  local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._8_8_ =
       local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_3d8.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d8.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_3d8.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
  local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p._4_4_ = 0;
  local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_3d8._tfac.pn.pi_ = __addr_len;
  local_358 = local_3d8._tfac.px;
  local_350.pi_ = __addr_len;
  boost::detail::shared_count::~shared_count(&local_350);
  local_360 = __return_storage_ptr__;
  if (is_regular) {
    if (avy::AvyLogFlag == '\0') {
      bVar7 = false;
    }
    else {
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"verbose","");
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,&local_328);
      bVar7 = cVar3._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
    }
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"The CFG is regular thus no need to abstract.\n",0x2d);
    }
    CFG::CFG(&local_b0,g);
    StronglyRegularToFA<covenant::Sym>::StronglyRegularToFA
              ((StronglyRegularToFA<covenant::Sym> *)local_278,&local_b0);
    CFG::~CFG(&local_b0);
    StronglyRegularToFA<covenant::Sym>::make_fa
              ((DFA<covenant::Sym> *)local_308,(StronglyRegularToFA<covenant::Sym> *)local_278);
    uVar2 = local_308._8_8_;
    uVar1 = local_308._0_8_;
    local_298.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3d8._tfac.pn.pi_;
    local_298.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3d8._tfac.px;
    local_308._0_8_ = (element_type *)0x0;
    local_308._8_8_ = (sp_counted_base *)0x0;
    local_3d8._tfac.px = (element_type *)uVar1;
    local_3d8._tfac.pn.pi_ = (sp_counted_base *)uVar2;
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_298.
                super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    local_298.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_3d8.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_298.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_3d8.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_298.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_3d8.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_3d8.start = local_2f8._0_4_;
    local_3d8.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2f8._8_8_;
    local_3d8.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvStack_2e8;
    local_3d8.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2e0;
    local_2f8._8_8_ = (pointer)0x0;
    pvStack_2e8 = (pointer)0x0;
    local_2e0 = (pointer)0x0;
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_298);
    local_298.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_3d8.eps.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_298.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_3d8.eps.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_298.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_3d8.eps.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           local_3d8.eps.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_3d8.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_2d8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_3d8.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_2d8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_3d8.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         SUB84(local_2d8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    local_3d8.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (undefined4)
         ((ulong)local_2d8.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
    local_2d8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2d8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_298);
    if ((void *)CONCAT44(local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                         local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p._4_4_,
                                       local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p._0_4_));
    }
    local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = local_2a0;
    local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ = CONCAT44(uStack_2a4,uStack_2a8);
    local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = local_2b0;
    local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._0_4_ = SUB84(local_2c0,0);
    local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._4_4_ = (undefined4)((ulong)local_2c0 >> 0x20);
    local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = uStack_2b8;
    local_2c0 = (_Bit_type *)0x0;
    uStack_2b8 = 0;
    local_2b0 = (_Bit_type *)0x0;
    uStack_2a8 = 0;
    local_2a0 = (_Bit_pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_2d8);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               *)(local_2f8 + 8));
    boost::detail::shared_count::~shared_count((shared_count *)(local_308 + 8));
    if (local_e0 != (_Bit_type *)0x0) {
      operator_delete(local_e0);
      local_e0 = (_Bit_type *)0x0;
      local_d8 = 0;
      local_d0 = (_Bit_type *)0x0;
      local_c8 = 0;
      local_c0 = (_Bit_pointer)0x0;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_f8);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_110);
    boost::detail::shared_count::~shared_count(local_120);
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
    ::~table(&local_158);
    if (local_170 != (pointer)0x0) {
      operator_delete(local_170);
    }
    CFGConnect::~CFGConnect(&local_1f8);
    CFG::~CFG((CFG *)local_278);
  }
  else {
    if (avy::AvyLogFlag == '\0') {
      bVar7 = false;
    }
    else {
      local_308._0_8_ = local_308 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"verbose","");
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,(key_type *)local_308);
      bVar7 = cVar3._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
      if ((element_type *)local_308._0_8_ != (element_type *)(local_308 + 0x10)) {
        operator_delete((void *)local_308._0_8_);
      }
    }
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Applied Sigma* abstraction.\n",0x1c);
    }
    s = DFA<covenant::Sym>::state(&local_3d8,0);
    local_3d8.start = (int)s;
    DFA<covenant::Sym>::accept(&local_3d8,s.id,__addr,(socklen_t *)__addr_len);
    this_00 = (pointer)(local_3d8.eps.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + s.id);
    __position._M_current =
         (int *)(this_00->
                super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_278._0_4_ = s;
    if ((pointer)__position._M_current ==
        (this_00->
        super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)this_00,__position,(int *)local_278);
    }
    else {
      *__position._M_current = s.id;
      (this_00->
      super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)(__position._M_current + 1);
    }
    if (0 < g->alphsz) {
      iVar5 = g->alphstart;
      uVar6 = iVar5 * 2;
      do {
        local_278._0_4_ = uVar6;
        DFA<covenant::Sym>::transition(&local_3d8,s,(Sym *)local_278,s);
        iVar5 = iVar5 + 1;
        uVar6 = uVar6 + 2;
      } while (iVar5 < g->alphsz + g->alphstart);
    }
  }
  DFA<covenant::Sym>::eps_elim(&local_3d8);
  __return_storage_ptr___00 = local_360;
  DFA<covenant::Sym>::makeDFA((dfa_t *)local_278,&local_3d8,g->alphstart,g->alphsz);
  DFA<covenant::Sym>::minimize
            (__return_storage_ptr___00,(DFA<covenant::Sym> *)local_278,g->alphstart,g->alphsz);
  bVar7 = DFA<covenant::Sym>::eliminateDeadStates(__return_storage_ptr___00);
  if (!bVar7) {
    psVar4 = (string *)__cxa_allocate_exception(0x20);
    local_348 = local_338;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_348,"One CFG is trivially empty.\n======\nUNSAT\n======","");
    *(string **)psVar4 = psVar4 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar4,local_348,local_348 + local_340);
    __cxa_throw(psVar4,&Exit::typeinfo,Exit::~Exit);
  }
  if (local_230 != (pointer)0x0) {
    operator_delete(local_230);
    local_230 = (pointer)0x0;
    local_228 = 0;
    local_220 = (pointer)0x0;
    local_218 = 0;
    local_210 = (pointer)0x0;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_248);
  std::
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ::~vector((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
             *)(local_278 + 0x18));
  boost::detail::shared_count::~shared_count((shared_count *)(local_278 + 8));
  if ((void *)CONCAT44(local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                       local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT44(local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl.super__Bvector_impl_data._M_start.
                                     super__Bit_iterator_base._M_p._4_4_,
                                     local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl.super__Bvector_impl_data._M_start.
                                     super__Bit_iterator_base._M_p._0_4_));
    local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
    local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._4_4_ = 0;
    local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ =
         local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_3d8.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_3d8.eps);
  std::
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ::~vector(&local_3d8.trans);
  boost::detail::shared_count::~shared_count(&local_3d8._tfac.pn);
  return __return_storage_ptr___00;
}

Assistant:

DFA<EdgeSym> do_abstraction(CFG &g, const bool is_regular)
  {
    DFA<EdgeSym> sfa (g.getTermFactory ());
    if (is_regular)
    {        
      LOG("verbose", cout << "The CFG is regular thus no need to abstract.\n");
      StronglyRegularToFA<EdgeSym>  conv(g);
      sfa = conv.make_fa();
    }
    else
    {
      LOG("verbose", cout << "Applied Sigma* abstraction.\n");
      State q0 = sfa.state(0);
      sfa.setStart(q0);
      sfa.accept(q0);
      sfa.eps_transition(q0,q0); 
      for (int i=g.alphstart; i<g.alphstart+g.alphsz; i++)
      {
        sfa.transition(q0,EdgeSym::mkTerm(i), q0);
      }
    }

    sfa.eps_elim();
    DFA<EdgeSym> dfa     = sfa.makeDFA(g.alphstart, g.alphsz);
    DFA<EdgeSym> min_dfa = dfa.minimize(g.alphstart, g.alphsz);
    bool is_not_empty    = min_dfa.eliminateDeadStates();
    if (!is_not_empty)
    {
      throw Exit("One CFG is trivially empty.\n======\nUNSAT\n======");
    }
    
    return min_dfa;
  }